

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_parse.c
# Opt level: O0

void write_buf(C_Parser *parser,char *buf,uint64_t val,int sz)

{
  int sz_local;
  uint64_t val_local;
  char *buf_local;
  C_Parser *parser_local;
  
  if (sz == 1) {
    *buf = (char)val;
  }
  else if (sz == 2) {
    *(short *)buf = (short)val;
  }
  else if (sz == 4) {
    *(int *)buf = (int)val;
  }
  else {
    if (sz != 8) {
      C_error(parser,"internal error at %s:%d",
              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/chibicc/chibicc_parse.c"
              ,0x587);
    }
    *(uint64_t *)buf = val;
  }
  return;
}

Assistant:

static void write_buf(C_Parser *parser, char *buf, uint64_t val, int sz) {
  if (sz == 1)
    *buf = val;
  else if (sz == 2)
    *(uint16_t *)buf = val;
  else if (sz == 4)
    *(uint32_t *)buf = val;
  else if (sz == 8)
    *(uint64_t *)buf = val;
  else
    unreachable(parser);
}